

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeCountAppearancesAll(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pFanout_00;
  undefined4 local_20;
  undefined4 local_1c;
  int Count;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Abc_ObjFanoutNum(pNode), local_1c < iVar1; local_1c = local_1c + 1) {
    pFanout_00 = Abc_ObjFanout(pNode,local_1c);
    iVar1 = Abc_NodeCountAppearances(pNode,pFanout_00);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

int Abc_NodeCountAppearancesAll( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i, Count = 0;
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Count += Abc_NodeCountAppearances( pNode, pFanout );
    return Count;
}